

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

QStringList * QtPrivate::QStringList_filter(QStringList *that,QRegularExpression *re)

{
  undefined1 uVar1;
  const_iterator o;
  QString *re_00;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QString *str;
  QStringList *__range1;
  QStringList *res;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_ffffffffffffff68;
  QList<QString> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined7 in_stack_ffffffffffffff88;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x54aca2);
  local_10.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QString>::begin(in_stack_ffffffffffffff70);
  o = QList<QString>::end(in_stack_ffffffffffffff70);
  while (uVar1 = QList<QString>::const_iterator::operator!=(&local_10,o), (bool)uVar1) {
    re_00 = QList<QString>::const_iterator::operator*(&local_10);
    in_stack_ffffffffffffff7f =
         QString::contains((QString *)CONCAT17(uVar1,in_stack_ffffffffffffff88),
                           (QRegularExpression *)re_00,
                           (QRegularExpressionMatch *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if ((bool)in_stack_ffffffffffffff7f) {
      QList<QString>::append(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    QList<QString>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QtPrivate::QStringList_filter(const QStringList *that, const QRegularExpression &re)
{
    QStringList res;
    for (const auto &str : *that) {
        if (str.contains(re))
            res.append(str);
    }
    return res;
}